

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void CompareOnTheFlyBone(comparer_context *comp)

{
  scoped_chunk chunk;
  allocator<char> local_439;
  scoped_chunk local_438;
  string local_430;
  aiString local_410;
  
  local_438.ctx = comp;
  comparer_context::push_elem(comp,"aiBone");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"mName",&local_439);
  comparer_context::cmp<aiString>(&local_410,comp,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mNumWeights",(allocator<char> *)&local_430);
  comparer_context::cmp<unsigned_int>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"mOffsetMatrix",&local_439);
  comparer_context::cmp<aiMatrix4x4t<float>>((aiMatrix4x4 *)&local_410,comp,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"mWeights",(allocator<char> *)&local_430);
  comparer_context::cmp_bounds<aiVertexWeight>(comp,(string *)&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  scoped_chunk::~scoped_chunk(&local_438);
  return;
}

Assistant:

void CompareOnTheFlyBone(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiBone");
    comp.cmp<aiString>("mName");
    comp.cmp<uint32_t>("mNumWeights");
    comp.cmp<aiMatrix4x4>("mOffsetMatrix");

    comp.cmp_bounds<aiVertexWeight>("mWeights");
}